

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  long lVar1;
  sqlite3_io_methods *psVar2;
  sqlite3_io_methods *psVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  sqlite3_io_methods *p;
  sqlite3_mutex *psVar8;
  void *pvVar9;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *__s;
  uint *puVar10;
  int *piVar11;
  long lVar12;
  code *zBuf;
  int errcode;
  ulong iOff;
  size_t sVar13;
  char *pcVar14;
  stat sStat;
  int local_108;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  long local_90;
  
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    iVar5 = sqlite3_initialize();
    if (iVar5 != 0) {
      return 7;
    }
    p = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    if (p == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    if ((sqlite3Config.bCoreMutex != 0) &&
       (psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar8 != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar8);
    }
    psVar2 = fd[2].pMethods;
    __s = psVar2->xTruncate;
    if (__s != (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) goto LAB_00156cfe;
    iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
    if ((iVar5 == 0) || (*(char *)((long)&psVar2->xRead + 5) != '\0')) {
      sVar13 = strlen((char *)fd[7].pMethods);
      iVar6 = sqlite3_initialize();
      iVar5 = 7;
      if (iVar6 == 0) {
        local_108 = (int)sVar13;
        __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)
              sqlite3Malloc((int)((long)local_108 + 0x46U));
        if (__s != (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) {
          memset(__s,0,(long)local_108 + 0x46U);
          zBuf = __s + 0x40;
          *(code **)(__s + 0x10) = zBuf;
          sqlite3_snprintf(local_108 + 6,(char *)zBuf,"%s-shm",fd[7].pMethods);
          *(undefined4 *)(__s + 0x18) = 0xffffffff;
          psVar3 = fd[2].pMethods;
          psVar3->xTruncate = __s;
          *(sqlite3_io_methods **)__s = psVar3;
          iVar6 = sqlite3_initialize();
          if (iVar6 == 0) {
            psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(0);
            *(sqlite3_mutex **)(__s + 8) = psVar8;
            if (psVar8 != (sqlite3_mutex *)0x0) {
              if (*(char *)((long)&psVar2->xRead + 5) != '\0') {
LAB_00156cfe:
                *(_func_int_sqlite3_file_ptr_sqlite3_int64 **)p = __s;
                *(int *)(__s + 0x30) = *(int *)(__s + 0x30) + 1;
                fd[8].pMethods = p;
                if ((sqlite3Config.bCoreMutex != 0) &&
                   (psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar8 != (sqlite3_mutex *)0x0))
                {
                  (*sqlite3Config.mutex.xMutexLeave)(psVar8);
                }
                if (*(sqlite3_mutex **)(__s + 8) == (sqlite3_mutex *)0x0) {
                  p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
                  *(sqlite3_io_methods **)(__s + 0x38) = p;
                }
                else {
                  (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(__s + 8));
                  psVar8 = *(sqlite3_mutex **)(__s + 8);
                  p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
                  *(sqlite3_io_methods **)(__s + 0x38) = p;
                  if (psVar8 != (sqlite3_mutex *)0x0) {
                    (*sqlite3Config.mutex.xMutexLeave)(psVar8);
                  }
                }
                goto LAB_00156b6d;
              }
              iVar6 = 0;
              iVar5 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
              if (iVar5 == 0) {
                iVar6 = 0x42;
              }
              else {
                __s[0x22] = (code)0x1;
              }
              uVar7 = robust_open((char *)zBuf,iVar6,local_a8 & 0x1ff);
              *(uint *)(__s + 0x18) = uVar7;
              if ((int)uVar7 < 0) {
                iVar5 = 0xe;
                sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0x6ab0,
                            "118a3b35693b134d56ebd780123b7fd6f1497668");
                pcVar14 = "open";
                errcode = 0xe;
                iVar6 = 0x6ab0;
              }
              else {
                (*aSyscall[0x14].pCurrent)((ulong)uVar7,(ulong)local_a4,(ulong)local_a0);
                uVar7 = *(uint *)(__s + 0x18);
                if (-1 < (int)uVar7) {
                  iVar5 = (*aSyscall[7].pCurrent)((ulong)uVar7,6);
                  if (iVar5 == -1) {
LAB_00157172:
                    if ((-1 < (int)*(uint *)(__s + 0x18)) &&
                       (iVar5 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(__s + 0x18),6), iVar5 == -1
                       )) {
                      iVar5 = 5;
                      goto LAB_00156f72;
                    }
                    goto LAB_00156cfe;
                  }
                  uVar7 = *(uint *)(__s + 0x18);
                }
                do {
                  iVar5 = (*aSyscall[6].pCurrent)((ulong)uVar7,0);
                  if (-1 < iVar5) {
                    if (iVar5 == 0) goto LAB_00157172;
                    break;
                  }
                  piVar11 = __errno_location();
                } while (*piVar11 == 4);
                pcVar14 = "ftruncate";
                iVar5 = 0x120a;
                errcode = 0x120a;
                iVar6 = 0x6ac0;
              }
              unixLogErrorAtLine(errcode,pcVar14,(char *)zBuf,iVar6);
            }
          }
          else {
            *(long *)(__s + 8) = 0;
          }
        }
      }
    }
    else {
      iVar5 = 0x70a;
    }
LAB_00156f72:
    unixShmPurge((unixFile *)fd);
    sqlite3_free(p);
    if (sqlite3Config.bCoreMutex == 0) {
      return iVar5;
    }
    psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    goto joined_r0x00156fa2;
  }
LAB_00156b6d:
  lVar1 = *(long *)fd[8].pMethods;
  if (*(sqlite3_mutex **)(lVar1 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar1 + 8));
  }
  uVar4 = *(ushort *)(lVar1 + 0x20);
  iVar6 = 0;
  if ((int)(uint)uVar4 <= iRegion) {
    *(int *)(lVar1 + 0x1c) = szRegion;
    if ((int)*(uint *)(lVar1 + 0x18) < 0) {
LAB_00156c56:
      pvVar9 = *(void **)(lVar1 + 0x28);
      iVar5 = sqlite3_initialize();
      iVar6 = 0xc0a;
      if ((iVar5 == 0) && (pvVar9 = sqlite3Realloc(pvVar9,(iRegion + 1) * 8), pvVar9 != (void *)0x0)
         ) {
        *(void **)(lVar1 + 0x28) = pvVar9;
        uVar4 = *(ushort *)(lVar1 + 0x20);
        if (iRegion < (int)(uint)uVar4) {
          iVar6 = 0;
        }
        else {
          sVar13 = (size_t)szRegion;
          do {
            if ((int)*(uint *)(lVar1 + 0x18) < 0) {
              iVar5 = sqlite3_initialize();
              iVar6 = 7;
              if ((iVar5 != 0) || (pvVar9 = sqlite3Malloc(szRegion), pvVar9 == (void *)0x0)) break;
              memset(pvVar9,0,sVar13);
            }
            else {
              pvVar9 = (void *)(*aSyscall[0x15].pCurrent)
                                         (0,sVar13,(ulong)((uint)(*(char *)(lVar1 + 0x22) == '\0') *
                                                           2 + 1),1,(ulong)*(uint *)(lVar1 + 0x18),
                                          uVar4 * sVar13);
              if (pvVar9 == (void *)0xffffffffffffffff) {
                pcVar14 = *(char **)(lVar1 + 0x10);
                puVar10 = (uint *)__errno_location();
                if (pcVar14 == (char *)0x0) {
                  pcVar14 = "";
                }
                iVar6 = 0x150a;
                sqlite3_log(0x150a,"os_unix.c:%d: (%d) %s(%s) - %s",0x6b57,(ulong)*puVar10,"mmap",
                            pcVar14,"");
                break;
              }
            }
            uVar4 = *(ushort *)(lVar1 + 0x20);
            *(void **)(*(long *)(lVar1 + 0x28) + (ulong)uVar4 * 8) = pvVar9;
            uVar4 = uVar4 + 1;
            *(ushort *)(lVar1 + 0x20) = uVar4;
            iVar6 = 0;
          } while ((uint)uVar4 <= (uint)iRegion);
        }
      }
    }
    else {
      iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar1 + 0x18),local_c0);
      iVar6 = 0x130a;
      if (iVar5 == 0) {
        iVar5 = (iRegion + 1) * szRegion;
        if (local_90 < iVar5) {
          if (bExtend == 0) {
            iVar6 = 0;
            goto LAB_00156c6f;
          }
          lVar12 = local_90 + 0xfff;
          if (-1 < local_90) {
            lVar12 = local_90;
          }
          iVar6 = iVar5 + 0xfff;
          if (-1 < iVar5) {
            iVar6 = iVar5;
          }
          iVar5 = (int)(lVar12 >> 0xc);
          if (iVar5 < iVar6 >> 0xc) {
            lVar12 = (long)(iVar6 >> 0xc) - (long)iVar5;
            iOff = (long)iVar5 << 0xc | 0xfff;
            do {
              iVar5 = seekAndWriteFd(*(int *)(lVar1 + 0x18),iOff,"",1,(int *)0x0);
              if (iVar5 != 1) {
                iVar6 = 0x130a;
                unixLogErrorAtLine(0x130a,"write",*(char **)(lVar1 + 0x10),0x6b3e);
                goto LAB_00156c6f;
              }
              iOff = iOff + 0x1000;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
        }
        goto LAB_00156c56;
      }
    }
LAB_00156c6f:
    uVar4 = *(ushort *)(lVar1 + 0x20);
  }
  if (iRegion < (int)(uint)uVar4) {
    pvVar9 = *(void **)(*(long *)(lVar1 + 0x28) + (long)iRegion * 8);
  }
  else {
    pvVar9 = (void *)0x0;
  }
  *pp = pvVar9;
  iVar5 = 8;
  if (*(char *)(lVar1 + 0x22) == '\0') {
    iVar5 = iVar6;
  }
  if (iVar6 != 0) {
    iVar5 = iVar6;
  }
  psVar8 = *(sqlite3_mutex **)(lVar1 + 8);
joined_r0x00156fa2:
  if (psVar8 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar8);
  }
  return iVar5;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  if( pShmNode->nRegion<=iRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = (iRegion+1)*szRegion;  /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, 0)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, (iRegion+1)*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while(pShmNode->nRegion<=iRegion){
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, szRegion,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }
      pShmNode->apRegion[pShmNode->nRegion] = pMem;
      pShmNode->nRegion++;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}